

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceVkImpl::TestTextureFormat(RenderDeviceVkImpl *this,TEXTURE_FORMAT TexFormat)

{
  bool bVar1;
  SAMPLE_COUNT SVar2;
  TEXTURE_FORMAT TVar3;
  VkFormat VVar4;
  VkResult VVar5;
  RESOURCE_DIMENSION_SUPPORT RVar6;
  Char *Message;
  pointer this_00;
  undefined1 local_140 [8];
  VkImageFormatProperties ImgFmtProps_3;
  uint local_118;
  VkFormatProperties vkUavFmtProps;
  VkFormat vkUavFormat;
  TEXTURE_FORMAT UAVFormat;
  VkImageFormatProperties ImgFmtProps_2;
  uint local_e0;
  VkFormatProperties vkDsvFmtProps;
  VkFormat vkDsvFormat;
  TEXTURE_FORMAT DSVFormat;
  VkImageFormatProperties ImgFmtProps_1;
  VkFormatProperties vkRtvFmtProps;
  VkFormat vkRtvFormat;
  undefined1 local_98 [2];
  TEXTURE_FORMAT RTVFormat;
  VkResult err;
  VkImageFormatProperties ImgFmtProps;
  uint local_70;
  VkFormatProperties vkSrvFmtProps;
  VkFormat vkSrvFormat;
  TEXTURE_FORMAT SRVFormat;
  anon_class_8_1_5d647ea0 CheckFormatProperties;
  VkPhysicalDevice vkPhysicalDevice;
  undefined1 local_40 [8];
  string msg;
  TextureFormatInfoExt *TexFormatInfo;
  TEXTURE_FORMAT TexFormat_local;
  RenderDeviceVkImpl *this_local;
  
  msg.field_2._8_8_ =
       std::
       vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
       ::operator[](&(this->
                     super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                     ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TextureFormatsInfo,
                    (ulong)TexFormat);
  if (((((reference)msg.field_2._8_8_)->super_TextureFormatInfo).Supported & 1U) == 0) {
    FormatString<char[32]>((string *)local_40,(char (*) [32])"Texture format is not supported");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"TestTextureFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x1d7);
    std::__cxx11::string::~string((string *)local_40);
  }
  this_00 = std::
            unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ::operator->(&this->m_PhysicalDevice);
  _vkSrvFormat = VulkanUtilities::VulkanPhysicalDevice::GetVkDeviceHandle(this_00);
  *(undefined4 *)(msg.field_2._8_8_ + 0x18) = 0;
  *(undefined4 *)(msg.field_2._8_8_ + 0x1c) = 0;
  CheckFormatProperties.vkPhysicalDevice = _vkSrvFormat;
  TVar3 = GetDefaultTextureViewFormat(TexFormat,TEXTURE_VIEW_SHADER_RESOURCE,8);
  if (TVar3 != TEX_FORMAT_UNKNOWN) {
    VVar4 = TexFormatToVkFormat(TVar3);
    memset((void *)((long)&ImgFmtProps.maxResourceSize + 4),0,0xc);
    (*vkGetPhysicalDeviceFormatProperties)
              (CheckFormatProperties.vkPhysicalDevice,VVar4,
               (VkFormatProperties *)((long)&ImgFmtProps.maxResourceSize + 4));
    if ((local_70 & 1) != 0) {
      *(bool *)(msg.field_2._8_8_ + 0x21) = (local_70 & 0x1000) != 0;
      Diligent::operator|=((BIND_FLAGS *)(msg.field_2._8_8_ + 0x18),BIND_SHADER_RESOURCE);
      memset(local_98,0,0x20);
      bVar1 = TestTextureFormat::anon_class_8_1_5d647ea0::operator()
                        ((anon_class_8_1_5d647ea0 *)&vkSrvFormat,VVar4,VK_IMAGE_TYPE_1D,4,
                         (VkImageFormatProperties *)local_98);
      if (bVar1) {
        RVar6 = Diligent::operator|(RESOURCE_DIMENSION_SUPPORT_TEX_1D,
                                    RESOURCE_DIMENSION_SUPPORT_TEX_1D_ARRAY);
        Diligent::operator|=((RESOURCE_DIMENSION_SUPPORT *)(msg.field_2._8_8_ + 0x1c),RVar6);
      }
      bVar1 = TestTextureFormat::anon_class_8_1_5d647ea0::operator()
                        ((anon_class_8_1_5d647ea0 *)&vkSrvFormat,VVar4,VK_IMAGE_TYPE_2D,4,
                         (VkImageFormatProperties *)local_98);
      if (bVar1) {
        RVar6 = Diligent::operator|(RESOURCE_DIMENSION_SUPPORT_TEX_2D,
                                    RESOURCE_DIMENSION_SUPPORT_TEX_2D_ARRAY);
        Diligent::operator|=((RESOURCE_DIMENSION_SUPPORT *)(msg.field_2._8_8_ + 0x1c),RVar6);
      }
      bVar1 = TestTextureFormat::anon_class_8_1_5d647ea0::operator()
                        ((anon_class_8_1_5d647ea0 *)&vkSrvFormat,VVar4,VK_IMAGE_TYPE_3D,4,
                         (VkImageFormatProperties *)local_98);
      if (bVar1) {
        Diligent::operator|=
                  ((RESOURCE_DIMENSION_SUPPORT *)(msg.field_2._8_8_ + 0x1c),
                   RESOURCE_DIMENSION_SUPPORT_TEX_3D);
      }
      VVar5 = (*vkGetPhysicalDeviceImageFormatProperties)
                        (CheckFormatProperties.vkPhysicalDevice,VVar4,VK_IMAGE_TYPE_2D,
                         VK_IMAGE_TILING_OPTIMAL,4,0x10,(VkImageFormatProperties *)local_98);
      if (VVar5 == VK_SUCCESS) {
        RVar6 = Diligent::operator|(RESOURCE_DIMENSION_SUPPORT_TEX_CUBE,
                                    RESOURCE_DIMENSION_SUPPORT_TEX_CUBE_ARRAY);
        Diligent::operator|=((RESOURCE_DIMENSION_SUPPORT *)(msg.field_2._8_8_ + 0x1c),RVar6);
      }
    }
  }
  TVar3 = GetDefaultTextureViewFormat(TexFormat,TEXTURE_VIEW_RENDER_TARGET,0x20);
  if (TVar3 != TEX_FORMAT_UNKNOWN) {
    VVar4 = TexFormatToVkFormat(TVar3);
    memset(&ImgFmtProps_1.maxResourceSize,0,0xc);
    (*vkGetPhysicalDeviceFormatProperties)
              (CheckFormatProperties.vkPhysicalDevice,VVar4,
               (VkFormatProperties *)&ImgFmtProps_1.maxResourceSize);
    if ((ImgFmtProps_1.maxResourceSize._4_4_ & 0x80) != 0) {
      memset(&vkDsvFormat,0,0x20);
      bVar1 = TestTextureFormat::anon_class_8_1_5d647ea0::operator()
                        ((anon_class_8_1_5d647ea0 *)&vkSrvFormat,VVar4,VK_IMAGE_TYPE_2D,0x80,
                         (VkImageFormatProperties *)&vkDsvFormat);
      if (bVar1) {
        Diligent::operator|=((BIND_FLAGS *)(msg.field_2._8_8_ + 0x18),BIND_RENDER_TARGET);
        SVar2 = VkSampleCountFlagsToSampleCount(ImgFmtProps_1.maxMipLevels);
        *(SAMPLE_COUNT *)(msg.field_2._8_8_ + 0x20) = SVar2;
      }
    }
  }
  TVar3 = GetDefaultTextureViewFormat(TexFormat,TEXTURE_VIEW_DEPTH_STENCIL,0x40);
  if (TVar3 != TEX_FORMAT_UNKNOWN) {
    VVar4 = TexFormatToVkFormat(TVar3);
    memset((void *)((long)&ImgFmtProps_2.maxResourceSize + 4),0,0xc);
    (*vkGetPhysicalDeviceFormatProperties)
              (CheckFormatProperties.vkPhysicalDevice,VVar4,
               (VkFormatProperties *)((long)&ImgFmtProps_2.maxResourceSize + 4));
    if ((local_e0 & 0x200) != 0) {
      memset(&vkUavFormat,0,0x20);
      bVar1 = TestTextureFormat::anon_class_8_1_5d647ea0::operator()
                        ((anon_class_8_1_5d647ea0 *)&vkSrvFormat,VVar4,VK_IMAGE_TYPE_2D,0x20,
                         (VkImageFormatProperties *)&vkUavFormat);
      if (bVar1) {
        Diligent::operator|=((BIND_FLAGS *)(msg.field_2._8_8_ + 0x18),BIND_DEPTH_STENCIL);
        SVar2 = VkSampleCountFlagsToSampleCount(ImgFmtProps_2.maxMipLevels);
        *(SAMPLE_COUNT *)(msg.field_2._8_8_ + 0x20) = SVar2;
      }
    }
  }
  TVar3 = GetDefaultTextureViewFormat(TexFormat,TEXTURE_VIEW_UNORDERED_ACCESS,0x40);
  if (TVar3 != TEX_FORMAT_UNKNOWN) {
    VVar4 = TexFormatToVkFormat(TVar3);
    memset((void *)((long)&ImgFmtProps_3.maxResourceSize + 4),0,0xc);
    (*vkGetPhysicalDeviceFormatProperties)
              (CheckFormatProperties.vkPhysicalDevice,VVar4,
               (VkFormatProperties *)((long)&ImgFmtProps_3.maxResourceSize + 4));
    if ((local_118 & 2) != 0) {
      memset(local_140,0,0x20);
      bVar1 = TestTextureFormat::anon_class_8_1_5d647ea0::operator()
                        ((anon_class_8_1_5d647ea0 *)&vkSrvFormat,VVar4,VK_IMAGE_TYPE_2D,8,
                         (VkImageFormatProperties *)local_140);
      if (bVar1) {
        Diligent::operator|=((BIND_FLAGS *)(msg.field_2._8_8_ + 0x18),BIND_UNORDERED_ACCESS);
      }
    }
  }
  return;
}

Assistant:

void RenderDeviceVkImpl::TestTextureFormat(TEXTURE_FORMAT TexFormat)
{
    TextureFormatInfoExt& TexFormatInfo = m_TextureFormatsInfo[TexFormat];
    VERIFY(TexFormatInfo.Supported, "Texture format is not supported");

    VkPhysicalDevice vkPhysicalDevice = m_PhysicalDevice->GetVkDeviceHandle();

    auto CheckFormatProperties =
        [vkPhysicalDevice](VkFormat vkFmt, VkImageType vkImgType, VkImageUsageFlags vkUsage, VkImageFormatProperties& ImgFmtProps) //
    {
        VkResult err = vkGetPhysicalDeviceImageFormatProperties(vkPhysicalDevice, vkFmt, vkImgType, VK_IMAGE_TILING_OPTIMAL,
                                                                vkUsage, 0, &ImgFmtProps);
        return err == VK_SUCCESS;
    };


    TexFormatInfo.BindFlags  = BIND_NONE;
    TexFormatInfo.Dimensions = RESOURCE_DIMENSION_SUPPORT_NONE;

    {
        TEXTURE_FORMAT SRVFormat = GetDefaultTextureViewFormat(TexFormat, TEXTURE_VIEW_SHADER_RESOURCE, BIND_SHADER_RESOURCE);
        if (SRVFormat != TEX_FORMAT_UNKNOWN)
        {
            VkFormat           vkSrvFormat   = TexFormatToVkFormat(SRVFormat);
            VkFormatProperties vkSrvFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(vkPhysicalDevice, vkSrvFormat, &vkSrvFmtProps);

            if (vkSrvFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT)
            {
                TexFormatInfo.Filterable = (vkSrvFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_FILTER_LINEAR_BIT) != 0;
                TexFormatInfo.BindFlags |= BIND_SHADER_RESOURCE;

                VkImageFormatProperties ImgFmtProps = {};
                if (CheckFormatProperties(vkSrvFormat, VK_IMAGE_TYPE_1D, VK_IMAGE_USAGE_SAMPLED_BIT, ImgFmtProps))
                    TexFormatInfo.Dimensions |= RESOURCE_DIMENSION_SUPPORT_TEX_1D | RESOURCE_DIMENSION_SUPPORT_TEX_1D_ARRAY;

                if (CheckFormatProperties(vkSrvFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_USAGE_SAMPLED_BIT, ImgFmtProps))
                    TexFormatInfo.Dimensions |= RESOURCE_DIMENSION_SUPPORT_TEX_2D | RESOURCE_DIMENSION_SUPPORT_TEX_2D_ARRAY;

                if (CheckFormatProperties(vkSrvFormat, VK_IMAGE_TYPE_3D, VK_IMAGE_USAGE_SAMPLED_BIT, ImgFmtProps))
                    TexFormatInfo.Dimensions |= RESOURCE_DIMENSION_SUPPORT_TEX_3D;

                {
                    VkResult err = vkGetPhysicalDeviceImageFormatProperties(vkPhysicalDevice, vkSrvFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_OPTIMAL,
                                                                            VK_IMAGE_USAGE_SAMPLED_BIT, VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT, &ImgFmtProps);
                    if (err == VK_SUCCESS)
                        TexFormatInfo.Dimensions |= RESOURCE_DIMENSION_SUPPORT_TEX_CUBE | RESOURCE_DIMENSION_SUPPORT_TEX_CUBE_ARRAY;
                }
            }
        }
    }

    {
        TEXTURE_FORMAT RTVFormat = GetDefaultTextureViewFormat(TexFormat, TEXTURE_VIEW_RENDER_TARGET, BIND_RENDER_TARGET);
        if (RTVFormat != TEX_FORMAT_UNKNOWN)
        {
            VkFormat           vkRtvFormat   = TexFormatToVkFormat(RTVFormat);
            VkFormatProperties vkRtvFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(vkPhysicalDevice, vkRtvFormat, &vkRtvFmtProps);

            if (vkRtvFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT)
            {
                VkImageFormatProperties ImgFmtProps = {};
                if (CheckFormatProperties(vkRtvFormat, VK_IMAGE_TYPE_2D, VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT, ImgFmtProps))
                {
                    TexFormatInfo.BindFlags |= BIND_RENDER_TARGET;
                    TexFormatInfo.SampleCounts = VkSampleCountFlagsToSampleCount(ImgFmtProps.sampleCounts);
                }
            }
        }
    }

    {
        TEXTURE_FORMAT DSVFormat = GetDefaultTextureViewFormat(TexFormat, TEXTURE_VIEW_DEPTH_STENCIL, BIND_DEPTH_STENCIL);
        if (DSVFormat != TEX_FORMAT_UNKNOWN)
        {
            VkFormat           vkDsvFormat   = TexFormatToVkFormat(DSVFormat);
            VkFormatProperties vkDsvFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(vkPhysicalDevice, vkDsvFormat, &vkDsvFmtProps);
            if (vkDsvFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT)
            {
                VkImageFormatProperties ImgFmtProps = {};
                if (CheckFormatProperties(vkDsvFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT, ImgFmtProps))
                {
                    // MoltenVK reports VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT for
                    // VK_FORMAT_D24_UNORM_S8_UINT even though the format is not supported.
                    TexFormatInfo.BindFlags |= BIND_DEPTH_STENCIL;
                    TexFormatInfo.SampleCounts = VkSampleCountFlagsToSampleCount(ImgFmtProps.sampleCounts);
                }
            }
        }
    }

    {
        TEXTURE_FORMAT UAVFormat = GetDefaultTextureViewFormat(TexFormat, TEXTURE_VIEW_UNORDERED_ACCESS, BIND_DEPTH_STENCIL);
        if (UAVFormat != TEX_FORMAT_UNKNOWN)
        {
            VkFormat           vkUavFormat   = TexFormatToVkFormat(UAVFormat);
            VkFormatProperties vkUavFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(vkPhysicalDevice, vkUavFormat, &vkUavFmtProps);
            if (vkUavFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT)
            {
                VkImageFormatProperties ImgFmtProps = {};
                if (CheckFormatProperties(vkUavFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_USAGE_STORAGE_BIT, ImgFmtProps))
                {
                    TexFormatInfo.BindFlags |= BIND_UNORDERED_ACCESS;
                }
            }
        }
    }
}